

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O0

void ScaleARGBRowDown2Linear_C
               (uint8_t *src_argb,ptrdiff_t src_stride,uint8_t *dst_argb,int dst_width)

{
  int x;
  int dst_width_local;
  uint8_t *dst_argb_local;
  ptrdiff_t src_stride_local;
  uint8_t *src_argb_local;
  
  dst_argb_local = dst_argb;
  src_argb_local = src_argb;
  for (x = 0; x < dst_width; x = x + 1) {
    *dst_argb_local = (uint8_t)((int)((uint)*src_argb_local + (uint)src_argb_local[4] + 1) >> 1);
    dst_argb_local[1] = (uint8_t)((int)((uint)src_argb_local[1] + (uint)src_argb_local[5] + 1) >> 1)
    ;
    dst_argb_local[2] = (uint8_t)((int)((uint)src_argb_local[2] + (uint)src_argb_local[6] + 1) >> 1)
    ;
    dst_argb_local[3] = (uint8_t)((int)((uint)src_argb_local[3] + (uint)src_argb_local[7] + 1) >> 1)
    ;
    src_argb_local = src_argb_local + 8;
    dst_argb_local = dst_argb_local + 4;
  }
  return;
}

Assistant:

void ScaleARGBRowDown2Linear_C(const uint8_t* src_argb,
                               ptrdiff_t src_stride,
                               uint8_t* dst_argb,
                               int dst_width) {
  int x;
  (void)src_stride;
  for (x = 0; x < dst_width; ++x) {
    dst_argb[0] = (src_argb[0] + src_argb[4] + 1) >> 1;
    dst_argb[1] = (src_argb[1] + src_argb[5] + 1) >> 1;
    dst_argb[2] = (src_argb[2] + src_argb[6] + 1) >> 1;
    dst_argb[3] = (src_argb[3] + src_argb[7] + 1) >> 1;
    src_argb += 8;
    dst_argb += 4;
  }
}